

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

string * __thiscall
ExactFloat::ToUniqueString_abi_cxx11_(string *__return_storage_ptr__,ExactFloat *this)

{
  uint uVar1;
  char prec_buf [20];
  string sStack_58;
  char local_38 [24];
  
  uVar1 = prec(this);
  sprintf(local_38,"<%d>",(ulong)uVar1);
  ToString_abi_cxx11_(&sStack_58,this);
  std::operator+(__return_storage_ptr__,&sStack_58,local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return __return_storage_ptr__;
}

Assistant:

string ExactFloat::ToUniqueString() const {
  char prec_buf[20];
  sprintf(prec_buf, "<%d>", prec());
  return ToString() + prec_buf;
}